

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall
cmFindPackageCommand::SetConfigDirCacheVariable(cmFindPackageCommand *this,string *value)

{
  string *name;
  bool bVar1;
  PolicyStatus PVar2;
  string_view value_00;
  char local_a1;
  string help;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  local_50.View_._M_len = 0x38;
  local_50.View_._M_str = "The directory containing a CMake configuration file for ";
  local_80.View_._M_str = (this->Name)._M_dataplus._M_p;
  local_80.View_._M_len = (this->Name)._M_string_length;
  local_a1 = '.';
  cmStrCat<char>(&help,&local_50,&local_80,&local_a1);
  name = &this->Variable;
  cmMakefile::AddCacheDefinition
            ((this->super_cmFindCommon).Makefile,name,value,help._M_dataplus._M_p,PATH,true);
  PVar2 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
  if (PVar2 == NEW) {
    bVar1 = cmMakefile::IsNormalDefinitionSet((this->super_cmFindCommon).Makefile,name);
    if (bVar1) {
      value_00._M_str = (value->_M_dataplus)._M_p;
      value_00._M_len = value->_M_string_length;
      cmMakefile::AddDefinition((this->super_cmFindCommon).Makefile,name,value_00);
    }
  }
  std::__cxx11::string::~string((string *)&help);
  return;
}

Assistant:

void cmFindPackageCommand::SetConfigDirCacheVariable(const std::string& value)
{
  std::string const help =
    cmStrCat("The directory containing a CMake configuration file for ",
             this->Name, '.');
  this->Makefile->AddCacheDefinition(this->Variable, value, help.c_str(),
                                     cmStateEnums::PATH, true);
  if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) ==
        cmPolicies::NEW &&
      this->Makefile->IsNormalDefinitionSet(this->Variable)) {
    this->Makefile->AddDefinition(this->Variable, value);
  }
}